

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# drawing.cpp
# Opt level: O3

void QtMWidgets::drawCylinder
               (QPainter *p,QRect *r,QColor *baseColor,bool roundLeftCorner,bool roundRightCorner)

{
  byte bVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  undefined3 in_register_00000081;
  QColor QVar6;
  QLinearGradient backgroundGradient;
  QLinearGradient secondVertLineGradient;
  QLinearGradient firstVertLineGradient;
  QPointF local_178;
  uint local_15c;
  undefined1 local_158 [12];
  int iStack_14c;
  undefined1 local_f8 [88];
  QColor local_a0 [5];
  QPointF local_48;
  
  local_f8._0_8_ = 0.0;
  local_f8._8_8_ = 0.0;
  local_158._0_8_ = 0.0;
  stack0xfffffffffffffeb0 = 1.0;
  QLinearGradient::QLinearGradient
            ((QLinearGradient *)local_a0,(QPointF *)local_f8,(QPointF *)local_158);
  QGradient::setCoordinateMode((CoordinateMode)local_a0);
  QVar6 = darkerColor(baseColor,0x32);
  local_f8._0_8_ = QVar6._0_8_;
  local_f8._8_6_ = QVar6.ct._4_6_;
  QGradient::setColorAt(0.0,local_a0);
  QVar6 = lighterColor(baseColor,0x19);
  local_f8._0_8_ = QVar6._0_8_;
  local_f8._8_6_ = QVar6.ct._4_6_;
  QGradient::setColorAt(0.5,local_a0);
  QVar6 = darkerColor(baseColor,0x32);
  local_f8._0_8_ = QVar6._0_8_;
  local_f8._8_6_ = QVar6.ct._4_6_;
  QGradient::setColorAt(1.0,local_a0);
  local_158._0_8_ = 0.0;
  stack0xfffffffffffffeb0 = 0.0;
  local_178.xp = 0.0;
  local_178.yp = 1.0;
  local_15c = CONCAT31(in_register_00000081,roundRightCorner);
  QLinearGradient::QLinearGradient((QLinearGradient *)local_f8,(QPointF *)local_158,&local_178);
  QGradient::setCoordinateMode((CoordinateMode)local_f8);
  QVar6 = darkerColor(baseColor,0x28);
  local_158._0_8_ = QVar6._0_8_;
  stack0xfffffffffffffeb0 = QVar6.ct._4_6_;
  QGradient::setColorAt(0.0,(QColor *)local_f8);
  QVar6 = lighterColor(baseColor,0x32);
  local_158._0_8_ = QVar6._0_8_;
  stack0xfffffffffffffeb0 = QVar6.ct._4_6_;
  QGradient::setColorAt(0.5,(QColor *)local_f8);
  QVar6 = darkerColor(baseColor,0x28);
  local_158._0_8_ = QVar6._0_8_;
  stack0xfffffffffffffeb0 = QVar6.ct._4_6_;
  QGradient::setColorAt(1.0,(QColor *)local_f8);
  QPainter::setPen((PenStyle)p);
  QBrush::QBrush((QBrush *)local_158,(QGradient *)local_a0);
  QPainter::setBrush((QBrush *)p);
  QBrush::~QBrush((QBrush *)local_158);
  local_158._4_4_ = (uint)roundLeftCorner * 2;
  local_158._0_4_ = r->x1;
  stack0xfffffffffffffeb0 =
       (qreal)CONCAT44((((uint)!roundLeftCorner * 4 + r->y2) - r->y1) + (uint)roundLeftCorner * 2 +
                       -4,r->x1);
  QPainter::drawRects((QRect *)p,(int)local_158);
  uVar2 = local_15c;
  bVar1 = (byte)local_15c;
  local_158._4_4_ = (local_15c & 0xff) * 2;
  local_158._0_4_ = r->x2;
  stack0xfffffffffffffeb0 =
       (qreal)CONCAT44((((uint)((byte)local_15c ^ 1) * 4 + r->y2) - r->y1) + -4 +
                       (local_15c & 0xff) * 2,r->x2);
  QPainter::drawRects((QRect *)p,(int)local_158);
  QBrush::QBrush((QBrush *)local_158,(QGradient *)local_f8);
  QPainter::setBrush((QBrush *)p);
  QBrush::~QBrush((QBrush *)local_158);
  local_158._0_4_ = r->x1 + 1;
  iVar4 = r->y2 - r->y1;
  local_158[4] = roundLeftCorner;
  local_158._5_3_ = 0;
  iVar3 = iVar4 + 1;
  if (roundLeftCorner) {
    iVar3 = iVar4;
  }
  stack0xfffffffffffffeb0 = (qreal)CONCAT44(iVar3 + -1,local_158._0_4_);
  QPainter::drawRects((QRect *)p,(int)local_158);
  iVar4 = r->x2 + -1;
  iVar5 = r->y2 - r->y1;
  local_158._0_8_ = CONCAT44(uVar2,iVar4) & 0xffffffffff;
  iVar3 = iVar5 + 1;
  if (bVar1 != 0) {
    iVar3 = iVar5;
  }
  stack0xfffffffffffffeb0 = (qreal)CONCAT44(iVar3 + -1,iVar4);
  QPainter::drawRects((QRect *)p,(int)local_158);
  local_158._0_4_ = r->x1 + 2;
  local_158._4_4_ = 0;
  stack0xfffffffffffffeb0 = (qreal)CONCAT44(r->y2 - r->y1,local_158._0_4_);
  QPainter::drawRects((QRect *)p,(int)local_158);
  local_158._0_4_ = r->x2 - 2;
  local_158._4_4_ = 0;
  stack0xfffffffffffffeb0 = (qreal)CONCAT44(r->y2 - r->y1,local_158._0_4_);
  QPainter::drawRects((QRect *)p,(int)local_158);
  local_178.xp = 0.0;
  local_178.yp = 0.0;
  local_48.xp._0_4_ = 0;
  local_48.xp._4_4_ = 0;
  local_48.yp._0_4_ = 0;
  local_48.yp._4_4_ = 0x3ff00000;
  QLinearGradient::QLinearGradient((QLinearGradient *)local_158,&local_178,&local_48);
  QGradient::setCoordinateMode((CoordinateMode)local_158);
  QGradient::setColorAt(0.0,(QColor *)local_158);
  QVar6 = lighterColor(baseColor,0x4b);
  local_178.xp = QVar6._0_8_;
  local_178.yp._0_6_ = QVar6.ct._4_6_;
  QGradient::setColorAt(0.15,(QColor *)local_158);
  QVar6 = lighterColor(baseColor,200);
  local_178.xp = QVar6._0_8_;
  local_178.yp._0_6_ = QVar6.ct._4_6_;
  QGradient::setColorAt(0.5,(QColor *)local_158);
  QVar6 = lighterColor(baseColor,0x4b);
  local_178.xp = QVar6._0_8_;
  local_178.yp._0_6_ = QVar6.ct._4_6_;
  QGradient::setColorAt(0.85,(QColor *)local_158);
  QGradient::setColorAt(1.0,(QColor *)local_158);
  QPainter::setPen((PenStyle)p);
  QBrush::QBrush((QBrush *)&local_178,(QGradient *)local_158);
  QPainter::setBrush((QBrush *)p);
  QBrush::~QBrush((QBrush *)&local_178);
  local_178.xp = (qreal)(ulong)(r->x1 + 3);
  local_178.yp = (qreal)CONCAT44(r->y2 - r->y1,r->x2 + -3);
  QPainter::drawRects((QRect *)p,(int)&local_178);
  QLinearGradient::~QLinearGradient((QLinearGradient *)local_158);
  QLinearGradient::~QLinearGradient((QLinearGradient *)local_f8);
  QLinearGradient::~QLinearGradient((QLinearGradient *)local_a0);
  return;
}

Assistant:

void
drawCylinder( QPainter * p, const QRect & r, const QColor & baseColor,
	bool roundLeftCorner, bool roundRightCorner )
{
	QLinearGradient firstVertLineGradient( QPointF( 0.0, 0.0 ),
		QPointF( 0.0, 1.0 ) );
	firstVertLineGradient.setCoordinateMode( QGradient::ObjectBoundingMode );
	firstVertLineGradient.setColorAt( 0.0, darkerColor( baseColor, 50 ) );
	firstVertLineGradient.setColorAt( 0.5, lighterColor( baseColor, 25 ) );
	firstVertLineGradient.setColorAt( 1.0, darkerColor( baseColor, 50 ) );

	QLinearGradient secondVertLineGradient( QPointF( 0.0, 0.0 ),
		QPointF( 0.0, 1.0 ) );
	secondVertLineGradient.setCoordinateMode( QGradient::ObjectBoundingMode );
	secondVertLineGradient.setColorAt( 0.0, darkerColor( baseColor, 40 ) );
	secondVertLineGradient.setColorAt( 0.5, lighterColor( baseColor, 50 ) );
	secondVertLineGradient.setColorAt( 1.0, darkerColor( baseColor, 40 ) );

	p->setPen( Qt::NoPen );
	p->setBrush( firstVertLineGradient );

	p->drawRect( r.x(), roundLeftCorner ? 2 : 0,
		1, roundLeftCorner ? r.height() - 4 : r.height() );
	p->drawRect( r.x() + r.width() - 1, roundRightCorner ? 2 : 0,
		1, roundRightCorner ? r.height() - 4 : r.height() );

	p->setBrush( secondVertLineGradient );

	p->drawRect( r.x() + 1, roundLeftCorner ? 1 : 0,
		1, roundLeftCorner ? r.height() - 2 : r.height() );
	p->drawRect( r.x() + r.width() - 2, roundRightCorner ? 1 : 0,
		1, roundRightCorner ? r.height() - 2 : r.height() );

	p->drawRect( r.x() + 2, 0, 1, r.height() );
	p->drawRect( r.x() + r.width() - 3, 0,
		1, r.height() );

	QLinearGradient backgroundGradient( QPointF( 0.0, 0.0 ),
		QPointF( 0.0, 1.0 ) );
	backgroundGradient.setCoordinateMode( QGradient::ObjectBoundingMode );
	backgroundGradient.setColorAt( 0.0, baseColor );
	backgroundGradient.setColorAt( 0.15, lighterColor( baseColor, 75 ) );
	backgroundGradient.setColorAt( 0.5, lighterColor( baseColor, 200 ) );
	backgroundGradient.setColorAt( 0.85, lighterColor( baseColor, 75 ) );
	backgroundGradient.setColorAt( 1.0, baseColor );

	p->setPen( Qt::NoPen );
	p->setBrush( backgroundGradient );
	p->drawRect( r.x() + 3, 0, r.width() - 2 * 3, r.height() );
}